

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O1

void __thiscall
flatbuffers::anon_unknown_0::NimBfbsGenerator::RegisterImports
          (NimBfbsGenerator *this,Object *object,Field *field,bool use_element)

{
  size_t __n;
  pointer __position;
  pointer pbVar1;
  int iVar2;
  long lVar3;
  Field *pFVar4;
  Object *pOVar5;
  Enum *pEVar6;
  long *plVar7;
  mapped_type *pmVar8;
  ushort uVar9;
  undefined7 in_register_00000009;
  size_type *psVar10;
  string *token;
  pointer pcVar11;
  int32_t iVar12;
  ulong uVar13;
  bool bVar14;
  string type_name;
  string ns;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str2_vec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  relative_to_vec;
  string importns;
  string import_path;
  string local_1a0;
  undefined1 *local_180;
  long local_178;
  undefined1 local_170;
  undefined7 uStack_16f;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  string local_120 [16];
  _Hash_node_base local_110 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  string *local_d0;
  _Alloc_hider local_c8;
  undefined1 local_c0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  local_c0._16_8_ = &local_a0;
  local_c0._24_8_ = 0;
  local_a0._M_local_buf[0] = '\0';
  local_180 = &local_170;
  local_178 = 0;
  local_170 = 0;
  lVar3 = -(long)*(int *)field;
  if ((int)CONCAT71(in_register_00000009,use_element) == 0) {
    if (*(ushort *)(field + -(long)*(int *)field) < 7) {
      uVar9 = 0;
    }
    else {
      uVar9 = *(ushort *)(field + lVar3 + 6);
    }
    if (uVar9 == 0) {
      pFVar4 = (Field *)0x0;
    }
    else {
      pFVar4 = field + (ulong)*(uint *)(field + uVar9) + (ulong)uVar9;
    }
    if (*(ushort *)(pFVar4 + -(long)*(int *)pFVar4) < 5) goto LAB_00337b12;
    uVar9 = *(ushort *)(pFVar4 + (4 - (long)*(int *)pFVar4));
  }
  else {
    if (*(ushort *)(field + -(long)*(int *)field) < 7) {
      uVar9 = 0;
    }
    else {
      uVar9 = *(ushort *)(field + lVar3 + 6);
    }
    if (uVar9 == 0) {
      pFVar4 = (Field *)0x0;
    }
    else {
      pFVar4 = field + (ulong)*(uint *)(field + uVar9) + (ulong)uVar9;
    }
    if (*(ushort *)(pFVar4 + -(long)*(int *)pFVar4) < 7) {
LAB_00337b12:
      uVar9 = 0;
    }
    else {
      uVar9 = *(ushort *)(pFVar4 + (6 - (long)*(int *)pFVar4));
    }
  }
  if (uVar9 == 0) {
    bVar14 = false;
  }
  else {
    bVar14 = pFVar4[uVar9].super_Table == (Table)0xf;
  }
  lVar3 = -(long)*(int *)field;
  if (bVar14) {
    if (*(ushort *)(field + -(long)*(int *)field) < 7) {
      uVar9 = 0;
    }
    else {
      uVar9 = *(ushort *)(field + lVar3 + 6);
    }
    if (uVar9 == 0) {
      pFVar4 = (Field *)0x0;
    }
    else {
      pFVar4 = field + (ulong)*(uint *)(field + uVar9) + (ulong)uVar9;
    }
    if (*(ushort *)(pFVar4 + -(long)*(int *)pFVar4) < 9) {
      uVar9 = 0;
    }
    else {
      uVar9 = *(ushort *)(pFVar4 + (8 - (long)*(int *)pFVar4));
    }
    if (uVar9 == 0) {
      iVar12 = -1;
    }
    else {
      iVar12 = *(int32_t *)(pFVar4 + uVar9);
    }
    pOVar5 = BaseBfbsGenerator::GetObjectByIndex(&this->super_BaseBfbsGenerator,iVar12);
    if (pOVar5 == this->current_obj_) goto LAB_0033832a;
    local_160._0_8_ = local_160 + 0x10;
    local_160._8_8_ = (pointer)0x0;
    local_160[0x10] = '\0';
    if (*(ushort *)(pOVar5 + -(long)*(int *)pOVar5) < 5) {
      uVar9 = 0;
    }
    else {
      uVar9 = *(ushort *)(pOVar5 + (4 - (long)*(int *)pOVar5));
    }
    uVar13 = (ulong)uVar9;
    local_140._0_8_ = local_140 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_140,pOVar5 + *(uint *)(pOVar5 + uVar13) + uVar13 + 4,
               pOVar5 + (ulong)*(uint *)(pOVar5 + *(uint *)(pOVar5 + uVar13) + uVar13) +
                        *(uint *)(pOVar5 + uVar13) + uVar13 + 4);
    Denamespace(&local_1a0,this,(string *)local_140,(string *)(local_c0 + 0x10),(string *)local_160)
    ;
    std::__cxx11::string::operator=((string *)&local_180,(string *)&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
      operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
    }
    pcVar11 = (pointer)local_160._8_8_;
    if ((pointer)local_160._8_8_ == (pointer)0x0) {
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a0,local_180,local_180 + local_178);
    }
    else {
      local_120._0_8_ = local_110;
      std::__cxx11::string::_M_construct<char*>
                (local_120,local_160._0_8_,(pointer)(local_160._0_8_ + local_160._8_8_));
      std::__cxx11::string::append((char *)local_120);
      plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_120,(ulong)local_180);
LAB_00337e60:
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_1a0.field_2._M_allocated_capacity = *psVar10;
        local_1a0.field_2._8_8_ = plVar7[3];
      }
      else {
        local_1a0.field_2._M_allocated_capacity = *psVar10;
        local_1a0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_1a0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
    }
  }
  else {
    if (*(ushort *)(field + -(long)*(int *)field) < 7) {
      uVar9 = 0;
    }
    else {
      uVar9 = *(ushort *)(field + lVar3 + 6);
    }
    if (uVar9 == 0) {
      pFVar4 = (Field *)0x0;
    }
    else {
      pFVar4 = field + (ulong)*(uint *)(field + uVar9) + (ulong)uVar9;
    }
    if (*(ushort *)(pFVar4 + -(long)*(int *)pFVar4) < 9) {
      uVar9 = 0;
    }
    else {
      uVar9 = *(ushort *)(pFVar4 + (8 - (long)*(int *)pFVar4));
    }
    if (uVar9 == 0) {
      iVar12 = -1;
    }
    else {
      iVar12 = *(int32_t *)(pFVar4 + uVar9);
    }
    pEVar6 = BaseBfbsGenerator::GetEnumByIndex(&this->super_BaseBfbsGenerator,iVar12);
    if (pEVar6 == this->current_enum_) goto LAB_0033832a;
    local_160._0_8_ = local_160 + 0x10;
    local_160._8_8_ = (pointer)0x0;
    local_160[0x10] = '\0';
    if (*(ushort *)(pEVar6 + -(long)*(int *)pEVar6) < 5) {
      uVar9 = 0;
    }
    else {
      uVar9 = *(ushort *)(pEVar6 + (4 - (long)*(int *)pEVar6));
    }
    uVar13 = (ulong)uVar9;
    local_140._0_8_ = local_140 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_140,pEVar6 + *(uint *)(pEVar6 + uVar13) + uVar13 + 4,
               pEVar6 + (ulong)*(uint *)(pEVar6 + *(uint *)(pEVar6 + uVar13) + uVar13) +
                        *(uint *)(pEVar6 + uVar13) + uVar13 + 4);
    Denamespace(&local_1a0,this,(string *)local_140,(string *)(local_c0 + 0x10),(string *)local_160)
    ;
    std::__cxx11::string::operator=((string *)&local_180,(string *)&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
      operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
    }
    pcVar11 = (pointer)local_160._8_8_;
    if ((pointer)local_160._8_8_ != (pointer)0x0) {
      local_120._0_8_ = local_110;
      std::__cxx11::string::_M_construct<char*>
                (local_120,local_160._0_8_,(pointer)(local_160._0_8_ + local_160._8_8_));
      std::__cxx11::string::append((char *)local_120);
      plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_120,(ulong)local_180);
      goto LAB_00337e60;
    }
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1a0,local_180,local_180 + local_178);
  }
  std::__cxx11::string::operator=((string *)&local_180,(string *)&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((pcVar11 != (pointer)0x0) && ((_Hash_node_base *)local_120._0_8_ != local_110)) {
    operator_delete((void *)local_120._0_8_,(ulong)((long)&(local_110[0]._M_nxt)->_M_nxt + 1));
  }
  if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
    operator_delete((void *)local_160._0_8_,CONCAT71(local_160._17_7_,local_160[0x10]) + 1);
  }
  if (*(ushort *)(object + -(long)*(int *)object) < 5) {
    uVar9 = 0;
  }
  else {
    uVar9 = *(ushort *)(object + (4 - (long)*(int *)object));
  }
  uVar13 = (ulong)uVar9;
  token = (string *)local_c0;
  local_d0 = token;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,object + *(uint *)(object + uVar13) + uVar13 + 4,
             object + (ulong)*(uint *)(object + *(uint *)(object + uVar13) + uVar13) +
                      *(uint *)(object + uVar13) + uVar13 + 4);
  local_160._0_8_ = local_160 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_160,local_d0,local_c8._M_p + (long)local_d0);
  local_1a0.field_2._M_allocated_capacity._0_2_ = 0x2e;
  local_1a0._M_string_length = 1;
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  StringSplit(&local_e8,(NimBfbsGenerator *)local_160,&local_1a0,token);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
    operator_delete((void *)local_160._0_8_,CONCAT71(local_160._17_7_,local_160[0x10]) + 1);
  }
  local_140._0_8_ = local_140 + 0x10;
  std::__cxx11::string::_M_construct<char*>((string *)local_140,local_180,local_180 + local_178);
  local_50.field_2._M_allocated_capacity._0_2_ = 0x2e;
  local_50._M_string_length = 1;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  StringSplit(&local_100,(NimBfbsGenerator *)local_140,&local_50,token);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,
                             local_50.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  while ((((pbVar1 = local_e8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
           __position = local_e8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
           local_e8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           local_e8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start &&
           (local_100.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_100.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)) &&
          (__n = (local_e8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,
          __n == *(size_type *)
                  ((long)local_100.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 8))) &&
         ((__n == 0 ||
          (iVar2 = bcmp(((local_e8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        ((local_100.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,__n),
          iVar2 == 0))))) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_e8,(iterator)__position);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_100,
               (iterator)
               local_100.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(undefined1 **)(pbVar1 + -1) !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&((_Base_ptr)(pbVar1 + -1))->_M_left) {
    operator_delete(*(undefined1 **)(pbVar1 + -1),
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&((_Base_ptr)(pbVar1 + -1))->_M_left)->_M_allocated_capacity + 1);
  }
  if (local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar13 = 0;
    do {
      local_80._0_2_ = 0x2e2e;
      local_90._8_8_ = 2;
      local_80._M_local_buf[2] = '\0';
      local_90._0_8_ = &local_80;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval(&local_100,
                       (const_iterator)
                       local_100.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,(value_type *)local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._0_8_ != &local_80) {
        operator_delete((void *)local_90._0_8_,
                        CONCAT53(local_80._3_5_,CONCAT12(local_80._M_local_buf[2],local_80._0_2_)) +
                        1);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)((long)local_e8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_e8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  local_70._8_8_ = 0;
  local_60._M_local_buf[0] = kUnknown;
  local_70._0_8_ = &local_60;
  if (local_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar3 = 8;
    uVar13 = 0;
    do {
      std::__cxx11::string::_M_append
                (local_70,*(ulong *)((long)&((_Hash_node_base *)
                                            ((long)local_100.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + -8))->
                                            _M_nxt + lVar3));
      if (uVar13 != ((long)local_100.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_100.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
        std::__cxx11::string::append(local_70);
      }
      uVar13 = uVar13 + 1;
      lVar3 = lVar3 + 0x20;
    } while (uVar13 < (ulong)((long)local_100.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_100.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  if (local_d0 != (string *)local_c0) {
    operator_delete(local_d0,(ulong)(local_c0._0_8_ + 1));
  }
  if (local_178 != 0) {
    lVar3 = 0;
    do {
      if (local_180[lVar3] == '.') {
        local_180[lVar3] = 0x5f;
      }
      lVar3 = lVar3 + 1;
    } while (local_178 != lVar3);
  }
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->imports_,(key_type *)local_70);
  std::__cxx11::string::_M_assign((string *)pmVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._0_8_ != &local_60) {
    operator_delete((void *)local_70._0_8_,CONCAT71(local_60._1_7_,local_60._M_local_buf[0]) + 1);
  }
LAB_0033832a:
  if (local_180 != &local_170) {
    operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._16_8_ != &local_a0) {
    operator_delete((void *)local_c0._16_8_,
                    CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void RegisterImports(const r::Object *object, const r::Field *field,
                       bool use_element = false) {
    std::string importns;
    std::string type_name;

    const r::BaseType type =
        use_element ? field->type()->element() : field->type()->base_type();

    if (IsStructOrTable(type)) {
      const r::Object *object_def = GetObjectByIndex(field->type()->index());
      if (object_def == current_obj_) { return; }
      std::string ns;
      type_name = Denamespace(object_def->name()->str(), importns, ns);
      type_name = ns.empty() ? type_name : ns + "." + type_name;
    } else {
      const r::Enum *enum_def = GetEnumByIndex(field->type()->index());
      if (enum_def == current_enum_) { return; }
      std::string ns;
      type_name = Denamespace(enum_def->name()->str(), importns, ns);
      type_name = ns.empty() ? type_name : ns + "." + type_name;
    }

    std::string import_path =
        GetRelativePathFromNamespace(object->name()->str(), type_name);
    std::replace(type_name.begin(), type_name.end(), '.', '_');
    RegisterImports(import_path, importns);
  }